

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitOrOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  AggregateFinalizeData *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  hugeint_t *rdata_1;
  BitState<duckdb::hugeint_t> **sdata_1;
  AggregateFinalizeData finalize_data;
  hugeint_t *rdata;
  BitState<duckdb::hugeint_t> **sdata;
  AggregateFinalizeData *in_stack_ffffffffffffff80;
  AggregateFinalizeData *finalize_data_00;
  hugeint_t *in_stack_ffffffffffffff88;
  AggregateInputData *in_stack_ffffffffffffff90;
  AggregateFinalizeData local_50;
  hugeint_t *local_38;
  BitState<duckdb::hugeint_t> **local_30;
  AggregateFinalizeData *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::BitState<duckdb::hugeint_t>*>((Vector *)0x981380);
    local_38 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x98138f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    BitwiseOperation::Finalize<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>>
              ((BitState<duckdb::hugeint_t> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    FlatVector::GetData<duckdb::BitState<duckdb::hugeint_t>*>((Vector *)0x9813dd);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x9813ec);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffff88,local_18,local_10);
    for (finalize_data_00 = (AggregateFinalizeData *)0x0; finalize_data_00 < local_20;
        finalize_data_00 = (AggregateFinalizeData *)((long)&finalize_data_00->result + 1)) {
      BitwiseOperation::Finalize<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>>
                ((BitState<duckdb::hugeint_t> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 finalize_data_00);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}